

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void GA_Set_chunk(int g_a,int *chunk)

{
  long lVar1;
  Integer *chunk_00;
  Integer _ga_work [7];
  Integer aIStack_48 [7];
  
  lVar1 = pnga_get_dimension((long)g_a);
  if (chunk == (int *)0x0) {
    chunk_00 = (Integer *)0x0;
  }
  else {
    chunk_00 = aIStack_48;
    if (0 < lVar1) {
      do {
        lVar1 = lVar1 + -1;
        aIStack_48[lVar1] = (long)*chunk;
        chunk = chunk + 1;
        chunk_00 = aIStack_48;
      } while (lVar1 != 0);
    }
  }
  pnga_set_chunk((long)g_a,chunk_00);
  return;
}

Assistant:

void GA_Set_chunk(int g_a, int chunk[])
{
    Integer aa, *ptr, ndim;
    Integer _ga_work[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    if(!chunk)ptr=(Integer*)0;  
    else {
      COPYC2F(chunk,_ga_work, ndim);
      ptr = _ga_work;
    }
    wnga_set_chunk(aa, ptr);
}